

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

void ReadLightInfo(aiLight *light,StreamReaderLE *stream)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  float local_5c;
  float local_58;
  float local_54;
  ai_real outer;
  ai_real inner;
  float local_48;
  ai_real E;
  ai_real spotCutoff;
  ai_real spotExponent;
  undefined1 local_34 [12];
  undefined1 local_28 [20];
  uint32_t type;
  StreamReaderLE *stream_local;
  aiLight *light_local;
  
  unique0x10000429 = stream;
  stream_local = (StreamReaderLE *)light;
  local_28._12_4_ = Assimp::StreamReader<false,_false>::GetU4(stream);
  if (local_28._12_4_ == 0) {
    *(undefined4 *)((long)&stream_local[0x12].buffer + 4) = 2;
  }
  else if (local_28._12_4_ == 1) {
    *(undefined4 *)((long)&stream_local[0x12].buffer + 4) = 3;
  }
  else if (local_28._12_4_ == 2) {
    *(undefined4 *)((long)&stream_local[0x12].buffer + 4) = 1;
  }
  else {
    *(undefined4 *)((long)&stream_local[0x12].buffer + 4) = 0;
  }
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)&stream_local[0x12].current = fVar2;
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)((long)&stream_local[0x12].current + 4) = fVar2;
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)&stream_local[0x12].end = fVar2;
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)((long)&stream_local[0x12].end + 4) = fVar2;
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)&stream_local[0x12].limit = fVar2;
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)((long)&stream_local[0x12].limit + 4) = fVar2;
  ReadColor((StreamReaderLE *)local_28);
  aiColor3D::operator=((aiColor3D *)&stream_local[0x13].buffer,(aiColor3D *)local_28);
  ReadColor((StreamReaderLE *)local_34);
  aiColor3D::operator=((aiColor3D *)&stream_local[0x13].limit,(aiColor3D *)local_34);
  ReadColor((StreamReaderLE *)&spotCutoff);
  aiColor3D::operator=
            ((aiColor3D *)((long)&stream_local[0x13].current + 4),(aiColor3D *)&spotCutoff);
  E = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  local_48 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)((long)&stream_local[0x13].stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       fVar2;
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)&stream_local[0x13].stream.
             super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       fVar2;
  fVar2 = Assimp::StreamReader<false,_false>::GetF4(stack0xffffffffffffffe8);
  *(float *)((long)&stream_local[0x13].stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + 4) = fVar2;
  outer = 1e-05;
  pfVar1 = std::max<float>(&E,&outer);
  inner = 1.0 / *pfVar1;
  dVar3 = std::pow(5.26271534330555e-315,(double)(ulong)(uint)inner);
  dVar3 = std::acos(dVar3);
  local_54 = SUB84(dVar3,0);
  dVar3 = std::pow(4.98503229837094e-315,(double)(ulong)(uint)inner);
  dVar3 = std::acos(dVar3);
  local_58 = SUB84(dVar3,0);
  local_5c = local_48 * 0.017453292;
  pfVar1 = std::min<float>(&local_58,&local_5c);
  local_58 = *pfVar1;
  pfVar1 = std::min<float>(&local_54,&local_58);
  *(float *)&stream_local[0x13].field_0x34 = *pfVar1;
  *(float *)&stream_local[0x14].stream.
             super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  return;
}

Assistant:

static void ReadLightInfo(aiLight* light, StreamReaderLE* stream)
{
    uint32_t type = stream->GetU4();
    switch (type) {
    case 0: light->mType = aiLightSource_POINT; break;
    case 1: light->mType = aiLightSource_SPOT; break;
    case 2: light->mType = aiLightSource_DIRECTIONAL; break;
    default: light->mType = aiLightSource_UNDEFINED; break;
    }

    light->mPosition.x = stream->GetF4();
    light->mPosition.y = stream->GetF4();
    light->mPosition.z = stream->GetF4();
    light->mDirection.x = stream->GetF4();
    light->mDirection.y = stream->GetF4();
    light->mDirection.z = stream->GetF4();
    light->mColorDiffuse = ReadColor(stream);
    light->mColorAmbient = ReadColor(stream);
    light->mColorSpecular = ReadColor(stream);
    ai_real spotExponent = stream->GetF4();
    ai_real spotCutoff = stream->GetF4();
    light->mAttenuationConstant = stream->GetF4();
    light->mAttenuationLinear = stream->GetF4();
    light->mAttenuationQuadratic = stream->GetF4();

    // Silo uses the OpenGL default lighting model for it's
    // spot cutoff/exponent. AssImp unfortunately, does not.
    // Let's try and approximate it by solving for the
    // 99% and 1% percentiles.
    //    OpenGL: I = cos(angle)^E
    //   Solving: angle = acos(I^(1/E))
    ai_real E = ai_real( 1.0 ) / std::max(spotExponent, (ai_real)0.00001);
    ai_real inner = std::acos(std::pow((ai_real)0.99, E));
    ai_real outer = std::acos(std::pow((ai_real)0.01, E));

    // Apply the cutoff.
    outer = std::min(outer, AI_DEG_TO_RAD(spotCutoff));

    light->mAngleInnerCone = std::min(inner, outer);
    light->mAngleOuterCone = outer;
}